

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestCamelCaseFieldNames::Clear(TestCamelCaseFieldNames *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  TestCamelCaseFieldNames *pTStack_18;
  uint32_t cached_has_bits;
  TestCamelCaseFieldNames *this_local;
  
  this_local = (TestCamelCaseFieldNames *)&this->field_0;
  local_1c = 0;
  pTStack_18 = this;
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeatedprimitivefield_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeatedstringfield_);
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.repeatedenumfield_);
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::Clear
            (&(this->field_0)._impl_.repeatedmessagefield_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeatedstringpiecefield_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeatedcordfield_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 0xf) != 0) {
    if ((local_1c & 1) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.stringfield_);
    }
    if ((local_1c & 2) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.stringpiecefield_);
    }
    if ((local_1c & 4) != 0) {
      google::protobuf::internal::ArenaStringPtr::ClearNonDefaultToEmpty
                (&(this->field_0)._impl_.cordfield_);
    }
    if ((local_1c & 8) != 0) {
      if ((this->field_0)._impl_.messagefield_ == (ForeignMessage *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
                   ,0x690b,"_impl_.messagefield_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      edition_unittest::ForeignMessage::Clear((this->field_0)._impl_.messagefield_);
    }
  }
  if ((local_1c & 0x30) != 0) {
    (this->field_0)._impl_.primitivefield_ = 0;
    (this->field_0)._impl_.enumfield_ = 4;
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestCamelCaseFieldNames::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestCamelCaseFieldNames)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeatedprimitivefield_.Clear();
  _impl_.repeatedstringfield_.Clear();
  _impl_.repeatedenumfield_.Clear();
  _impl_.repeatedmessagefield_.Clear();
  _impl_.repeatedstringpiecefield_.Clear();
  _impl_.repeatedcordfield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.stringfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.stringpiecefield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.cordfield_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(_impl_.messagefield_ != nullptr);
      _impl_.messagefield_->Clear();
    }
  }
  if ((cached_has_bits & 0x00000030u) != 0) {
    _impl_.primitivefield_ = 0;
    _impl_.enumfield_ = 4;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}